

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

double __thiscall slang::SVInt::pow(SVInt *this,double __x,double __y)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  uint64_t *puVar4;
  long in_RDX;
  long in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double dVar5;
  bitwidth_t rhsBits;
  bitwidth_t lhsBits;
  undefined1 in_stack_000003df;
  SVInt *in_stack_000003e0;
  SVInt *in_stack_000003e8;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 isSigned;
  SVInt *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  bitwidth_t bits;
  SVInt *this_00;
  SVInt *in_stack_ffffffffffffff88;
  SVInt *in_stack_ffffffffffffff98;
  
  bits = (bitwidth_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  isSigned = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  if (((*(byte *)(in_RSI + 0xd) & 1) == 0) && ((*(byte *)(in_RDX + 0xd) & 1) == 0)) {
    this_00 = this;
    bVar2 = getActiveBits(in_stack_ffffffffffffff60);
    bVar3 = getActiveBits(in_stack_ffffffffffffff60);
    if (bVar2 == 0) {
      if (bVar3 == 0) {
        SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,(bool)isSigned);
        dVar5 = extraout_XMM0_Qa_00;
      }
      else if (((*(byte *)(in_RDX + 0xc) & 1) == 0) ||
              (bVar1 = isNegative(in_stack_ffffffffffffff60), !bVar1)) {
        SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,(bool)isSigned);
        dVar5 = extraout_XMM0_Qa_02;
      }
      else {
        createFillX((bitwidth_t)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
        dVar5 = extraout_XMM0_Qa_01;
      }
    }
    else if ((bVar3 == 0) || (bVar2 == 1)) {
      SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,(bool)isSigned);
      dVar5 = extraout_XMM0_Qa_03;
    }
    else {
      if (((*(byte *)(in_RSI + 0xc) & 1) != 0) &&
         (bVar1 = isNegative(in_stack_ffffffffffffff60), bVar1)) {
        reductionAnd(in_stack_ffffffffffffff88);
        bVar1 = logic_t::operator_cast_to_bool((logic_t *)in_stack_ffffffffffffff60);
        if (bVar1) {
          bVar1 = isOdd((SVInt *)0xbb2d3b);
          if (!bVar1) {
            SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,(bool)isSigned);
            return extraout_XMM0_Qa_05;
          }
          SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,(bool)isSigned);
          return extraout_XMM0_Qa_04;
        }
      }
      if (((*(byte *)(in_RDX + 0xc) & 1) == 0) ||
         (bVar1 = isNegative(in_stack_ffffffffffffff60), !bVar1)) {
        if (((*(byte *)(in_RSI + 0xc) & 1) == 0) ||
           (bVar1 = isNegative(in_stack_ffffffffffffff60), !bVar1)) {
          if ((bVar2 == 2) && (puVar4 = getRawData(in_stack_ffffffffffffff60), *puVar4 == 2)) {
            SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,
                  SUB81((ulong)&stack0xffffffffffffff88 >> 0x38,0));
            shl(this_00,this);
            ~SVInt(this);
            dVar5 = extraout_XMM0_Qa_09;
          }
          else {
            modPow(in_stack_000003e8,in_stack_000003e0,(bool)in_stack_000003df);
            dVar5 = extraout_XMM0_Qa_10;
          }
        }
        else {
          bVar1 = isOdd((SVInt *)0xbb2e00);
          if (bVar1) {
            operator-(in_stack_ffffffffffffff98);
            modPow(in_stack_000003e8,in_stack_000003e0,(bool)in_stack_000003df);
            operator-(in_stack_ffffffffffffff98);
            ~SVInt(this);
            ~SVInt(this);
            dVar5 = extraout_XMM0_Qa_07;
          }
          else {
            operator-(in_stack_ffffffffffffff98);
            modPow(in_stack_000003e8,in_stack_000003e0,(bool)in_stack_000003df);
            ~SVInt(this);
            dVar5 = extraout_XMM0_Qa_08;
          }
        }
      }
      else {
        SVInt(this,bits,(uint64_t)in_stack_ffffffffffffff60,(bool)isSigned);
        dVar5 = extraout_XMM0_Qa_06;
      }
    }
  }
  else {
    createFillX((bitwidth_t)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
    dVar5 = extraout_XMM0_Qa;
  }
  return dVar5;
}

Assistant:

SVInt SVInt::pow(const SVInt& rhs) const {
    // ignore unknowns
    if (unknownFlag || rhs.unknownFlag)
        return createFillX(bitWidth, signFlag);

    // Handle special cases first (note that the result always has
    // the bit width of *this)
    bitwidth_t lhsBits = getActiveBits();
    bitwidth_t rhsBits = rhs.getActiveBits();
    // The second operand of the power operator shall be treated as self-determined
    if (lhsBits == 0) {
        if (rhsBits == 0) // 0**0 == 1
            return SVInt(bitWidth, 1, signFlag);
        if (rhs.signFlag && rhs.isNegative()) // 0**-y == x
            return createFillX(bitWidth, signFlag);
        // 0**y == 0
        return SVInt(bitWidth, 0, signFlag);
    }

    // x**0 == 1 || 1**y == 1
    if (rhsBits == 0 || lhsBits == 1)
        return SVInt(bitWidth, 1, signFlag);

    if (signFlag && isNegative()) {
        if (reductionAnd()) { // x == -1
            // if rhs is odd, result is -1
            // otherwise, result is 1
            if (rhs.isOdd())
                return SVInt(bitWidth, UINT64_MAX, signFlag);
            else
                return SVInt(bitWidth, 1, signFlag);
        }
    }

    if (rhs.signFlag && rhs.isNegative()) // x**-y == 0
        return SVInt(bitWidth, 0, signFlag);

    // we have one of two cases left (rhs is always positive here):
    // 1. lhs > 1 (just do the operation)
    // 2. lhs < -1 (invert, do the op, figure out the sign at the end)
    if (signFlag && isNegative()) {
        // result is negative if rhs is odd, otherwise positive
        if (rhs.isOdd())
            return -modPow(-(*this), rhs, signFlag);
        else
            return modPow(-(*this), rhs, signFlag);
    }

    // Optimization for the common case of 2**y
    if (lhsBits == 2 && getRawData()[0] == 2)
        return SVInt(bitWidth, 1, signFlag).shl(rhs);

    return modPow(*this, rhs, signFlag);
}